

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O2

void ncnn::conv_im2col_sgemm_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,int kernel_w,int kernel_h,int stride_w,
               int stride_h,Mat *_bias,vector<float,_std::allocator<float>_> scale_requant,
               Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  void *pvVar20;
  int iVar21;
  size_t sVar22;
  size_t sVar23;
  size_t sVar24;
  undefined1 uVar25;
  int u;
  int _w;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  ulong uVar36;
  long lVar37;
  uint _h;
  int _c;
  long lVar38;
  ulong uVar39;
  int n_1;
  void *pvVar40;
  char *pcVar41;
  ulong uVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  ulong uVar47;
  long lVar48;
  int iVar49;
  long lVar50;
  int iVar51;
  void *pvVar52;
  undefined1 *puVar53;
  long lVar54;
  ulong uVar55;
  int n_4;
  ulong uVar56;
  void *pvVar57;
  int i;
  uint uVar58;
  long lVar59;
  undefined1 *puVar60;
  float fVar61;
  float fVar62;
  long local_230;
  undefined1 *local_220;
  int sum0 [4];
  undefined1 *local_1c0;
  Mat kernel_tm;
  Mat bottom_tm;
  int sum3 [4];
  int sum2 [4];
  int sum1 [4];
  Mat bottom_im2row;
  
  iVar45 = bottom_blob->c;
  iVar43 = top_blob->w;
  iVar44 = top_blob->h;
  pvVar52 = _kernel->data;
  pvVar20 = _bias->data;
  _w = iVar45 * kernel_h * kernel_w;
  _h = iVar44 * iVar43;
  iVar49 = bottom_blob->w;
  iVar29 = top_blob->c;
  uVar36 = (ulong)iVar29;
  Mat::Mat(&bottom_im2row,_w,_h,1,
           *(Allocator **)
            (scale_requant.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish + 4));
  pvVar57 = bottom_im2row.data;
  uVar42 = 0;
  if (0 < kernel_w) {
    uVar42 = (ulong)(uint)kernel_w;
  }
  iVar46 = 0;
  if (0 < kernel_h) {
    iVar46 = kernel_h;
  }
  iVar26 = 0;
  if (0 < iVar45) {
    iVar26 = iVar45;
  }
  if (iVar43 < 1) {
    iVar43 = 0;
  }
  iVar21 = 0;
  if (iVar44 < 1) {
    iVar44 = 0;
  }
  iVar51 = 0;
  for (iVar35 = 0; iVar35 != iVar44; iVar35 = iVar35 + 1) {
    iVar27 = iVar21;
    for (iVar34 = 0; iVar34 != iVar43; iVar34 = iVar34 + 1) {
      for (_c = 0; _c != iVar26; _c = _c + 1) {
        Mat::channel(&bottom_tm,bottom_blob,_c);
        pvVar40 = bottom_tm.data;
        Mat::~Mat(&bottom_tm);
        iVar33 = iVar27;
        for (iVar28 = 0; iVar28 != iVar46; iVar28 = iVar28 + 1) {
          for (uVar47 = 0; uVar42 != uVar47; uVar47 = uVar47 + 1) {
            *(undefined1 *)((long)pvVar57 + uVar47 + (long)iVar51) =
                 *(undefined1 *)((long)pvVar40 + (long)(iVar33 + (int)uVar47));
          }
          iVar51 = iVar51 + (int)uVar47;
          iVar33 = iVar33 + iVar49;
        }
      }
      iVar27 = iVar27 + stride_w;
    }
    iVar21 = iVar21 + stride_h * iVar49;
  }
  iVar43 = kernel_h * kernel_w * 4;
  Mat::Mat(&bottom_tm,iVar43,iVar45,((int)_h / 4) * -3 + _h,1,
           *(Allocator **)
            (scale_requant.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish + 4));
  local_230 = 1;
  uVar47 = 0;
  uVar42 = (ulong)(uint)((int)_h >> 2);
  if ((int)_h >> 2 < 1) {
    uVar42 = uVar47;
  }
  lVar50 = 3;
  lVar54 = 2;
  for (uVar56 = 0; sVar24 = bottom_im2row.elemsize, pvVar40 = bottom_im2row.data,
      sVar23 = bottom_tm.cstep, sVar22 = bottom_tm.elemsize, pvVar57 = bottom_tm.data,
      uVar56 != uVar42; uVar56 = uVar56 + 1) {
    lVar30 = (long)bottom_im2row.w;
    kernel_tm.data = (void *)(bottom_tm.cstep * uVar56 * bottom_tm.elemsize + (long)bottom_tm.data);
    kernel_tm.refcount = (int *)0x0;
    kernel_tm.elemsize = bottom_tm.elemsize;
    kernel_tm.elempack = bottom_tm.elempack;
    kernel_tm.allocator = bottom_tm.allocator;
    kernel_tm.dims = 2;
    kernel_tm.w = bottom_tm.w;
    kernel_tm.h = bottom_tm.h;
    kernel_tm.c = 1;
    kernel_tm.cstep = (size_t)(bottom_tm.h * bottom_tm.w);
    Mat::~Mat(&kernel_tm);
    lVar59 = sVar23 * sVar22 * uVar56;
    lVar31 = sVar24 * lVar50 * lVar30;
    lVar37 = sVar24 * lVar54 * lVar30;
    lVar38 = sVar24 * local_230 * lVar30;
    lVar30 = sVar24 * uVar47 * lVar30;
    for (lVar48 = 0; (int)lVar48 + 1 < _w; lVar48 = lVar48 + 2) {
      *(undefined1 *)((long)pvVar57 + lVar48 * 4 + lVar59) =
           *(undefined1 *)((long)pvVar40 + lVar48 + lVar30);
      *(undefined1 *)((long)pvVar57 + lVar48 * 4 + lVar59 + 1) =
           *(undefined1 *)((long)pvVar40 + lVar48 + lVar30 + 1);
      *(undefined1 *)((long)pvVar57 + lVar48 * 4 + lVar59 + 2) =
           *(undefined1 *)((long)pvVar40 + lVar48 + lVar38);
      *(undefined1 *)((long)pvVar57 + lVar48 * 4 + lVar59 + 3) =
           *(undefined1 *)((long)pvVar40 + lVar48 + lVar38 + 1);
      *(undefined1 *)((long)pvVar57 + lVar48 * 4 + lVar59 + 4) =
           *(undefined1 *)((long)pvVar40 + lVar48 + lVar37);
      *(undefined1 *)((long)pvVar57 + lVar48 * 4 + lVar59 + 5) =
           *(undefined1 *)((long)pvVar40 + lVar48 + lVar37 + 1);
      *(undefined1 *)((long)pvVar57 + lVar48 * 4 + lVar59 + 6) =
           *(undefined1 *)((long)pvVar40 + lVar48 + lVar31);
      *(undefined1 *)((long)pvVar57 + lVar48 * 4 + lVar59 + 7) =
           *(undefined1 *)((long)pvVar40 + lVar48 + lVar31 + 1);
    }
    for (; (int)lVar48 < _w; lVar48 = lVar48 + 1) {
      *(undefined1 *)((long)pvVar57 + lVar48 * 4 + lVar59) =
           *(undefined1 *)((long)pvVar40 + lVar48 + lVar30);
      *(undefined1 *)((long)pvVar57 + lVar48 * 4 + lVar59 + 1) =
           *(undefined1 *)((long)pvVar40 + lVar48 + lVar38);
      *(undefined1 *)((long)pvVar57 + lVar48 * 4 + lVar59 + 2) =
           *(undefined1 *)((long)pvVar40 + lVar48 + lVar37);
      *(undefined1 *)((long)pvVar57 + lVar48 * 4 + lVar59 + 3) =
           *(undefined1 *)((long)pvVar40 + lVar48 + lVar31);
    }
    lVar50 = lVar50 + 4;
    lVar54 = lVar54 + 4;
    local_230 = local_230 + 4;
    uVar47 = uVar47 + 4;
  }
  for (uVar58 = _h & 0xfffffffc; iVar44 = bottom_im2row.w, sVar22 = bottom_im2row.elemsize,
      pvVar57 = bottom_im2row.data, (int)uVar58 < (int)_h; uVar58 = uVar58 + 1) {
    pvVar40 = (void *)((long)((int)uVar58 % 4 + (int)uVar58 / 4) * bottom_tm.cstep *
                       bottom_tm.elemsize + (long)bottom_tm.data);
    kernel_tm.refcount = (int *)0x0;
    kernel_tm.elemsize = bottom_tm.elemsize;
    kernel_tm.elempack = bottom_tm.elempack;
    kernel_tm.allocator = bottom_tm.allocator;
    kernel_tm.dims = 2;
    kernel_tm.w = bottom_tm.w;
    kernel_tm.h = bottom_tm.h;
    kernel_tm.c = 1;
    kernel_tm.cstep = (size_t)(bottom_tm.h * bottom_tm.w);
    kernel_tm.data = pvVar40;
    Mat::~Mat(&kernel_tm);
    lVar50 = (long)(int)(iVar44 * uVar58) * sVar22;
    for (lVar54 = 0; (int)lVar54 + 1 < _w; lVar54 = lVar54 + 2) {
      *(undefined1 *)((long)pvVar40 + lVar54) = *(undefined1 *)((long)pvVar57 + lVar54 + lVar50);
      *(undefined1 *)((long)pvVar40 + lVar54 + 1) =
           *(undefined1 *)((long)pvVar57 + lVar54 + lVar50 + 1);
    }
    for (; (int)lVar54 < _w; lVar54 = lVar54 + 1) {
      *(undefined1 *)((long)pvVar40 + lVar54) = *(undefined1 *)((long)pvVar57 + lVar54 + lVar50);
    }
  }
  Mat::Mat(&kernel_tm,iVar43,iVar45,iVar29 % 4 + iVar29 / 4,1,
           *(Allocator **)
            (scale_requant.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish + 4));
  uVar47 = 0;
  uVar42 = (ulong)(uint)(iVar29 >> 2);
  if (iVar29 >> 2 < 1) {
    uVar42 = uVar47;
  }
  iVar29 = iVar45 * kernel_h * kernel_w;
  iVar43 = iVar29 * 4;
  iVar44 = iVar29 * 3;
  iVar29 = iVar29 * 2;
  iVar49 = _w;
  for (uVar56 = 0; sVar23 = kernel_tm.cstep, sVar22 = kernel_tm.elemsize, pvVar57 = kernel_tm.data,
      uVar56 != uVar42; uVar56 = uVar56 + 1) {
    iVar46 = (int)uVar47;
    sum0._0_8_ = kernel_tm.cstep * uVar56 * kernel_tm.elemsize + (long)kernel_tm.data;
    sum0[2] = 0;
    sum0[3] = 0;
    Mat::~Mat((Mat *)sum0);
    lVar54 = sVar23 * sVar22 * uVar56;
    for (lVar50 = 0; (int)lVar50 + 1 < _w; lVar50 = lVar50 + 2) {
      *(undefined1 *)((long)pvVar57 + lVar50 * 4 + lVar54) =
           *(undefined1 *)((long)pvVar52 + lVar50 + iVar46);
      *(undefined1 *)((long)pvVar57 + lVar50 * 4 + lVar54 + 1) =
           *(undefined1 *)((long)pvVar52 + lVar50 + (long)iVar46 + 1);
      *(undefined1 *)((long)pvVar57 + lVar50 * 4 + lVar54 + 2) =
           *(undefined1 *)((long)pvVar52 + lVar50 + iVar49);
      *(undefined1 *)((long)pvVar57 + lVar50 * 4 + lVar54 + 3) =
           *(undefined1 *)((long)pvVar52 + lVar50 + (long)iVar49 + 1);
      *(undefined1 *)((long)pvVar57 + lVar50 * 4 + lVar54 + 4) =
           *(undefined1 *)((long)pvVar52 + lVar50 + iVar29);
      *(undefined1 *)((long)pvVar57 + lVar50 * 4 + lVar54 + 5) =
           *(undefined1 *)((long)pvVar52 + lVar50 + (long)iVar29 + 1);
      *(undefined1 *)((long)pvVar57 + lVar50 * 4 + lVar54 + 6) =
           *(undefined1 *)((long)pvVar52 + lVar50 + iVar44);
      *(undefined1 *)((long)pvVar57 + lVar50 * 4 + lVar54 + 7) =
           *(undefined1 *)((long)pvVar52 + lVar50 + (long)iVar44 + 1);
    }
    for (; (int)lVar50 < _w; lVar50 = lVar50 + 1) {
      *(undefined1 *)((long)pvVar57 + lVar50 * 4 + lVar54) =
           *(undefined1 *)((long)pvVar52 + lVar50 + iVar46);
      *(undefined1 *)((long)pvVar57 + lVar50 * 4 + lVar54 + 1) =
           *(undefined1 *)((long)pvVar52 + lVar50 + iVar49);
      *(undefined1 *)((long)pvVar57 + lVar50 * 4 + lVar54 + 2) =
           *(undefined1 *)((long)pvVar52 + lVar50 + iVar29);
      *(undefined1 *)((long)pvVar57 + lVar50 * 4 + lVar54 + 3) =
           *(undefined1 *)((long)pvVar52 + lVar50 + iVar44);
    }
    uVar47 = (ulong)(uint)(iVar46 + iVar43);
    iVar49 = iVar49 + iVar43;
    iVar29 = iVar29 + iVar43;
    iVar44 = iVar44 + iVar43;
  }
  iVar45 = iVar45 * kernel_h * kernel_w * ((uint)(uVar36 >> 2) & 0x3fffffff) * 4;
  uVar56 = uVar36 & 0xfffffffffffffffc;
  for (uVar47 = uVar56; (long)uVar47 < (long)uVar36; uVar47 = uVar47 + 1) {
    uVar32 = (ulong)(uint)((int)uVar47 >> 0x1f) << 0x20 | uVar47 & 0xffffffff;
    pvVar57 = (void *)((long)((int)((long)uVar32 % 4) + (int)((long)uVar32 / 4)) * kernel_tm.cstep *
                       kernel_tm.elemsize + (long)kernel_tm.data);
    sum0[2] = 0;
    sum0[3] = 0;
    sum0._0_8_ = pvVar57;
    Mat::~Mat((Mat *)sum0);
    for (lVar50 = 0; (int)lVar50 + 1 < _w; lVar50 = lVar50 + 2) {
      *(undefined1 *)((long)pvVar57 + lVar50) = *(undefined1 *)((long)pvVar52 + lVar50 + iVar45);
      *(undefined1 *)((long)pvVar57 + lVar50 + 1) =
           *(undefined1 *)((long)pvVar52 + lVar50 + (long)iVar45 + 1);
    }
    for (; (int)lVar50 < _w; lVar50 = lVar50 + 1) {
      *(undefined1 *)((long)pvVar57 + lVar50) = *(undefined1 *)((long)pvVar52 + lVar50 + iVar45);
    }
    iVar45 = iVar45 + _w;
  }
  for (uVar47 = 0; uVar47 != uVar42; uVar47 = uVar47 + 1) {
    uVar32 = uVar47 * 4;
    Mat::channel((Mat *)sum0,top_blob,(uint)uVar32);
    puVar60 = (undefined1 *)sum0._0_8_;
    Mat::~Mat((Mat *)sum0);
    uVar55 = uVar32 | 1;
    Mat::channel((Mat *)sum0,top_blob,(uint)uVar32 | 1);
    puVar53 = (undefined1 *)sum0._0_8_;
    Mat::~Mat((Mat *)sum0);
    uVar39 = uVar32 | 2;
    Mat::channel((Mat *)sum0,top_blob,(int)uVar39);
    local_220 = (undefined1 *)sum0._0_8_;
    Mat::~Mat((Mat *)sum0);
    uVar32 = uVar32 | 3;
    Mat::channel((Mat *)sum0,top_blob,(int)uVar32);
    local_1c0 = (undefined1 *)sum0._0_8_;
    Mat::~Mat((Mat *)sum0);
    if (pvVar20 == (void *)0x0) {
      fVar3 = 0.0;
      fVar1 = 0.0;
      fVar2 = 0.0;
      fVar62 = 0.0;
    }
    else {
      fVar1 = *(float *)((long)pvVar20 + uVar47 * 0x10);
      fVar2 = *(float *)((long)pvVar20 + uVar55 * 4);
      fVar3 = *(float *)((long)pvVar20 + uVar39 * 4);
      fVar62 = *(float *)((long)pvVar20 + uVar32 * 4);
    }
    lVar50 = *(long *)scale_requant.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
    fVar4 = *(float *)(lVar50 + uVar47 * 0x20);
    fVar5 = *(float *)(lVar50 + 4 + uVar47 * 0x20);
    fVar6 = *(float *)(lVar50 + uVar55 * 8);
    fVar7 = *(float *)(lVar50 + 4 + uVar55 * 8);
    fVar8 = *(float *)(lVar50 + uVar39 * 8);
    fVar9 = *(float *)(lVar50 + 4 + uVar39 * 8);
    fVar10 = *(float *)(lVar50 + uVar32 * 8);
    fVar11 = *(float *)(lVar50 + 4 + uVar32 * 8);
    for (uVar32 = 0; (long)(uVar32 | 3) < (long)(int)_h; uVar32 = uVar32 + 4) {
      pvVar52 = (void *)((uVar32 >> 2) * bottom_tm.cstep * bottom_tm.elemsize + (long)bottom_tm.data
                        );
      sum0[2] = 0;
      sum0[3] = 0;
      sum0._0_8_ = pvVar52;
      Mat::~Mat((Mat *)sum0);
      pcVar41 = (char *)(kernel_tm.cstep * uVar47 * kernel_tm.elemsize + (long)kernel_tm.data);
      sum0[2] = 0;
      sum0[3] = 0;
      sum0._0_8_ = pcVar41;
      Mat::~Mat((Mat *)sum0);
      sum0[0] = 0;
      sum0[1] = 0;
      sum0[2] = 0;
      sum0[3] = 0;
      sum1[0] = 0;
      sum1[1] = 0;
      sum1[2] = 0;
      sum1[3] = 0;
      sum2[0] = 0;
      sum2[1] = 0;
      sum2[2] = 0;
      sum2[3] = 0;
      sum3[0] = 0;
      sum3[1] = 0;
      sum3[2] = 0;
      sum3[3] = 0;
      for (uVar58 = 0; (int)(uVar58 | 1) < _w; uVar58 = uVar58 + 2) {
        cVar12 = *pcVar41;
        cVar13 = pcVar41[1];
        cVar14 = pcVar41[2];
        cVar15 = pcVar41[3];
        cVar16 = pcVar41[4];
        cVar17 = pcVar41[5];
        cVar18 = pcVar41[6];
        cVar19 = pcVar41[7];
        for (lVar50 = 0; lVar50 != 8; lVar50 = lVar50 + 2) {
          iVar43 = (int)*(char *)((long)pvVar52 + lVar50);
          iVar45 = (int)*(char *)((long)pvVar52 + lVar50 + 1);
          *(int *)((long)sum0 + lVar50 * 2) =
               iVar45 * cVar13 + iVar43 * cVar12 + *(int *)((long)sum0 + lVar50 * 2);
          *(int *)((long)sum1 + lVar50 * 2) =
               cVar15 * iVar45 + cVar14 * iVar43 + *(int *)((long)sum1 + lVar50 * 2);
          *(int *)((long)sum2 + lVar50 * 2) =
               cVar17 * iVar45 + cVar16 * iVar43 + *(int *)((long)sum2 + lVar50 * 2);
          *(int *)((long)sum3 + lVar50 * 2) =
               iVar45 * cVar19 + iVar43 * cVar18 + *(int *)((long)sum3 + lVar50 * 2);
        }
        pcVar41 = pcVar41 + 8;
        pvVar52 = (void *)((long)pvVar52 + 8);
      }
      for (; (int)uVar58 < _w; uVar58 = uVar58 + 1) {
        cVar12 = *pcVar41;
        cVar13 = pcVar41[1];
        cVar14 = pcVar41[2];
        cVar15 = pcVar41[3];
        for (lVar50 = 0; lVar50 != 4; lVar50 = lVar50 + 1) {
          iVar45 = (int)*(char *)((long)pvVar52 + lVar50);
          sum0[lVar50] = sum0[lVar50] + iVar45 * cVar12;
          sum1[lVar50] = sum1[lVar50] + cVar13 * iVar45;
          sum2[lVar50] = sum2[lVar50] + cVar14 * iVar45;
          sum3[lVar50] = sum3[lVar50] + iVar45 * cVar15;
        }
        pcVar41 = pcVar41 + 4;
        pvVar52 = (void *)((long)pvVar52 + 4);
      }
      for (lVar50 = 0; lVar50 != 4; lVar50 = lVar50 + 1) {
        fVar61 = roundf(((float)sum0[lVar50] * fVar4 + fVar1) * fVar5);
        iVar45 = (int)fVar61;
        if ((int)fVar61 < -0x7e) {
          iVar45 = -0x7f;
        }
        uVar25 = (undefined1)iVar45;
        if (0x7e < iVar45) {
          uVar25 = 0x7f;
        }
        puVar60[lVar50] = uVar25;
        fVar61 = roundf(((float)sum1[lVar50] * fVar6 + fVar2) * fVar7);
        iVar45 = (int)fVar61;
        if (iVar45 < -0x7e) {
          iVar45 = -0x7f;
        }
        uVar25 = (undefined1)iVar45;
        if (0x7e < iVar45) {
          uVar25 = 0x7f;
        }
        puVar53[lVar50] = uVar25;
        fVar61 = roundf(((float)sum2[lVar50] * fVar8 + fVar3) * fVar9);
        iVar45 = (int)fVar61;
        if (iVar45 < -0x7e) {
          iVar45 = -0x7f;
        }
        uVar25 = (undefined1)iVar45;
        if (0x7e < iVar45) {
          uVar25 = 0x7f;
        }
        local_220[lVar50] = uVar25;
        fVar61 = roundf(((float)sum3[lVar50] * fVar10 + fVar62) * fVar11);
        iVar45 = (int)fVar61;
        if (iVar45 < -0x7e) {
          iVar45 = -0x7f;
        }
        uVar25 = (undefined1)iVar45;
        if (0x7e < iVar45) {
          uVar25 = 0x7f;
        }
        local_1c0[lVar50] = uVar25;
      }
      puVar60 = puVar60 + 4;
      puVar53 = puVar53 + 4;
      local_220 = local_220 + 4;
      local_1c0 = local_1c0 + 4;
    }
    while (pvVar52 = bottom_tm.data, uVar58 = (uint)uVar32, (int)uVar58 < (int)_h) {
      uVar32 = (ulong)((uVar58 & 3) + ((uint)(uVar32 >> 2) & 0x3fffffff));
      lVar30 = bottom_tm.cstep * bottom_tm.elemsize;
      sum0._0_8_ = uVar32 * lVar30 + (long)bottom_tm.data;
      sum0[2] = 0;
      sum0[3] = 0;
      Mat::~Mat((Mat *)sum0);
      pvVar57 = kernel_tm.data;
      lVar54 = kernel_tm.cstep * uVar47 * kernel_tm.elemsize;
      pcVar41 = (char *)((long)kernel_tm.data + lVar54);
      sum0[2] = 0;
      sum0[3] = 0;
      sum0._0_8_ = pcVar41;
      Mat::~Mat((Mat *)sum0);
      lVar30 = lVar30 * uVar32;
      iVar45 = 0;
      iVar44 = 0;
      iVar49 = 0;
      iVar43 = 0;
      for (lVar50 = 0; (int)lVar50 + 1 < _w; lVar50 = lVar50 + 2) {
        iVar29 = (int)*(char *)((long)pvVar52 + lVar50 + lVar30);
        iVar46 = (int)*(char *)((long)pvVar52 + lVar50 + lVar30 + 1);
        iVar45 = pcVar41[1] * iVar46 + *pcVar41 * iVar29 + iVar45;
        iVar44 = pcVar41[3] * iVar46 + pcVar41[2] * iVar29 + iVar44;
        iVar49 = pcVar41[5] * iVar46 + pcVar41[4] * iVar29 + iVar49;
        iVar43 = pcVar41[7] * iVar46 + pcVar41[6] * iVar29 + iVar43;
        pcVar41 = pcVar41 + 8;
      }
      for (; (int)lVar50 < _w; lVar50 = lVar50 + 1) {
        iVar29 = (int)*(char *)((long)pvVar52 + lVar50 + lVar30);
        iVar45 = iVar45 + *(char *)((long)pvVar57 + lVar50 * 4 + lVar54) * iVar29;
        iVar44 = iVar44 + *(char *)((long)pvVar57 + lVar50 * 4 + lVar54 + 1) * iVar29;
        iVar49 = iVar49 + *(char *)((long)pvVar57 + lVar50 * 4 + lVar54 + 2) * iVar29;
        iVar43 = iVar43 + *(char *)((long)pvVar57 + lVar50 * 4 + lVar54 + 3) * iVar29;
      }
      fVar61 = roundf(((float)iVar45 * fVar4 + fVar1) * fVar5);
      iVar29 = -0x7f;
      iVar45 = (int)fVar61;
      if ((int)fVar61 < -0x7e) {
        iVar45 = iVar29;
      }
      uVar25 = (undefined1)iVar45;
      if (0x7e < iVar45) {
        uVar25 = 0x7f;
      }
      *puVar60 = uVar25;
      fVar61 = roundf(((float)iVar44 * fVar6 + fVar2) * fVar7);
      iVar45 = (int)fVar61;
      if ((int)fVar61 < -0x7e) {
        iVar45 = iVar29;
      }
      uVar25 = (undefined1)iVar45;
      if (0x7e < iVar45) {
        uVar25 = 0x7f;
      }
      *puVar53 = uVar25;
      fVar61 = roundf(((float)iVar49 * fVar8 + fVar3) * fVar9);
      iVar45 = (int)fVar61;
      if ((int)fVar61 < -0x7e) {
        iVar45 = iVar29;
      }
      uVar25 = (undefined1)iVar45;
      if (0x7e < iVar45) {
        uVar25 = 0x7f;
      }
      *local_220 = uVar25;
      fVar61 = roundf(((float)iVar43 * fVar10 + fVar62) * fVar11);
      iVar45 = (int)fVar61;
      if ((int)fVar61 < -0x7e) {
        iVar45 = iVar29;
      }
      uVar25 = (undefined1)iVar45;
      if (0x7e < iVar45) {
        uVar25 = 0x7f;
      }
      *local_1c0 = uVar25;
      puVar60 = puVar60 + 1;
      puVar53 = puVar53 + 1;
      local_220 = local_220 + 1;
      local_1c0 = local_1c0 + 1;
      uVar32 = (ulong)(uVar58 + 1);
    }
  }
  iVar45 = 0;
  if (0 < _w) {
    iVar45 = _w;
  }
  for (; (long)uVar56 < (long)uVar36; uVar56 = uVar56 + 1) {
    iVar43 = (int)uVar56;
    Mat::channel((Mat *)sum0,top_blob,iVar43);
    puVar60 = (undefined1 *)sum0._0_8_;
    Mat::~Mat((Mat *)sum0);
    if (pvVar20 == (void *)0x0) {
      fVar1 = 0.0;
    }
    else {
      fVar1 = *(float *)((long)pvVar20 + uVar56 * 4);
    }
    fVar2 = *(float *)(*(long *)scale_requant.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_start + uVar56 * 8);
    fVar3 = *(float *)(*(long *)scale_requant.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_start + 4 + uVar56 * 8);
    iVar44 = (int)((long)((ulong)(uint)(iVar43 >> 0x1f) << 0x20 | uVar56 & 0xffffffff) / 4);
    lVar50 = (long)(iVar44 * -3 + iVar43);
    for (uVar42 = 0; (long)(uVar42 | 3) < (long)(int)_h; uVar42 = uVar42 + 4) {
      pvVar52 = (void *)((uVar42 >> 2) * bottom_tm.cstep * bottom_tm.elemsize + (long)bottom_tm.data
                        );
      sum0[2] = 0;
      sum0[3] = 0;
      sum0._0_8_ = pvVar52;
      Mat::~Mat((Mat *)sum0);
      pcVar41 = (char *)(kernel_tm.cstep * lVar50 * kernel_tm.elemsize + (long)kernel_tm.data);
      sum0[2] = 0;
      sum0[3] = 0;
      sum0._0_8_ = pcVar41;
      Mat::~Mat((Mat *)sum0);
      sum0[0] = 0;
      sum0[1] = 0;
      sum0[2] = 0;
      sum0[3] = 0;
      for (uVar58 = 0; (int)(uVar58 | 1) < _w; uVar58 = uVar58 + 2) {
        cVar12 = *pcVar41;
        cVar13 = pcVar41[1];
        for (lVar54 = 0; lVar54 != 4; lVar54 = lVar54 + 1) {
          sum0[lVar54] = (int)*(char *)((long)pvVar52 + lVar54 * 2 + 1) * (int)cVar13 +
                         (int)*(char *)((long)pvVar52 + lVar54 * 2) * (int)cVar12 + sum0[lVar54];
        }
        pcVar41 = pcVar41 + 2;
        pvVar52 = (void *)((long)pvVar52 + 8);
      }
      for (; (int)uVar58 < _w; uVar58 = uVar58 + 1) {
        cVar12 = *pcVar41;
        for (lVar54 = 0; lVar54 != 4; lVar54 = lVar54 + 1) {
          sum0[lVar54] = sum0[lVar54] + (int)*(char *)((long)pvVar52 + lVar54) * (int)cVar12;
        }
        pcVar41 = pcVar41 + 1;
        pvVar52 = (void *)((long)pvVar52 + 4);
      }
      for (lVar54 = 0; lVar54 != 4; lVar54 = lVar54 + 1) {
        fVar62 = roundf(((float)sum0[lVar54] * fVar2 + fVar1) * fVar3);
        iVar49 = (int)fVar62;
        if (iVar49 < -0x7e) {
          iVar49 = -0x7f;
        }
        if (0x7e < iVar49) {
          iVar49 = 0x7f;
        }
        puVar60[lVar54] = (char)iVar49;
      }
      puVar60 = puVar60 + 4;
    }
    while (pvVar52 = bottom_tm.data, uVar58 = (uint)uVar42, (int)uVar58 < (int)_h) {
      uVar42 = (ulong)((uVar58 & 3) + ((uint)(uVar42 >> 2) & 0x3fffffff));
      lVar30 = bottom_tm.cstep * bottom_tm.elemsize;
      sum0._0_8_ = uVar42 * lVar30 + (long)bottom_tm.data;
      sum0[2] = 0;
      sum0[3] = 0;
      Mat::~Mat((Mat *)sum0);
      sVar23 = kernel_tm.cstep;
      sVar22 = kernel_tm.elemsize;
      pvVar57 = kernel_tm.data;
      sum0._0_8_ = kernel_tm.cstep * lVar50 * kernel_tm.elemsize + (long)kernel_tm.data;
      sum0[2] = 0;
      sum0[3] = 0;
      Mat::~Mat((Mat *)sum0);
      iVar49 = 0;
      for (lVar54 = 0; iVar45 != (int)lVar54; lVar54 = lVar54 + 1) {
        iVar49 = iVar49 + (int)*(char *)((long)pvVar52 + lVar54 + lVar30 * uVar42) *
                          (int)*(char *)((long)pvVar57 +
                                        lVar54 + sVar23 * (long)(iVar43 + iVar44 * -3) * sVar22);
      }
      fVar62 = roundf(((float)iVar49 * fVar2 + fVar1) * fVar3);
      iVar49 = (int)fVar62;
      if (iVar49 < -0x7e) {
        iVar49 = -0x7f;
      }
      uVar25 = (undefined1)iVar49;
      if (0x7e < iVar49) {
        uVar25 = 0x7f;
      }
      *puVar60 = uVar25;
      puVar60 = puVar60 + 1;
      uVar42 = (ulong)(uVar58 + 1);
    }
  }
  Mat::~Mat(&kernel_tm);
  Mat::~Mat(&bottom_tm);
  Mat::~Mat(&bottom_im2row);
  return;
}

Assistant:

static void conv_im2col_sgemm_int8_requant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, \
            const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Mat &_bias, std::vector<float> scale_requant, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    // im2row
    Mat bottom_im2row(kernel_h*kernel_w*inch, outw*outh, 1UL, opt.workspace_allocator);
    {
        signed char* ret = (signed char*)bottom_im2row;
        int retID = 0;
    
        for (int i=0; i<outh; i++)
        {
            for (int j=0; j<outw; j++)
            {
                for (int p=0; p<inch; p++)
                {
                    const signed char* input = bottom_blob.channel(p);
                    for (int u=0; u<kernel_h; u++)
                    {
                        for (int v=0; v<kernel_w; v++)
                        {    
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }                
                }
            }
        }
    }    

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // int M = outch;  // outch
    int N = outw * outh; // outsize or out stride
    int K = kernel_w * kernel_h * inch; // ksize * inch

    // bottom_im2row memory packed 4 x 4
    Mat bottom_tm(4*kernel_size, inch, out_size/4 + out_size%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii=0; ii<nn_size; ii++)
        {
            int i = ii * 4;

            const signed char* img0 = bottom_im2row.row<signed char>(i);
            const signed char* img1 = bottom_im2row.row<signed char>(i+1);
            const signed char* img2 = bottom_im2row.row<signed char>(i+2);
            const signed char* img3 = bottom_im2row.row<signed char>(i+3);

            signed char* tmpptr = bottom_tm.channel(i/4);

            int q = 0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img1[0];
                tmpptr[3] = img1[1];
                tmpptr[4] = img2[0];
                tmpptr[5] = img2[1];
                tmpptr[6] = img3[0];
                tmpptr[7] = img3[1];

                tmpptr += 8;
                img0 += 2;
                img1 += 2;
                img2 += 2;
                img3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img1[0];
                tmpptr[2] = img2[0];
                tmpptr[3] = img3[0];

                tmpptr += 4;
                img0 += 1;
                img1 += 1;
                img2 += 1;
                img3 += 1;                
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_size_start; i<out_size; i++)
        {
            const signed char* img0 = bottom_im2row.row<signed char>(i);

            signed char* tmpptr = bottom_tm.channel(i/4 + i%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];

                tmpptr += 2;
                img0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += 1;
            }
        }       
    }

    // kernel memory packed 4 x 4
    Mat kernel_tm(4*kernel_size, inch, outch/4 + outch%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int p = pp * 4;

            const signed char* k0 = kernel + (p+0)*inch*kernel_size;
            const signed char* k1 = kernel + (p+1)*inch*kernel_size;
            const signed char* k2 = kernel + (p+2)*inch*kernel_size;
            const signed char* k3 = kernel + (p+3)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4);

            int q=0;
            for (; q+1<inch*kernel_size; q+=2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp[2] = k1[0];
                ktmp[3] = k1[1];
                ktmp[4] = k2[0];
                ktmp[5] = k2[1];
                ktmp[6] = k3[0];
                ktmp[7] = k3[1];

                ktmp += 8;

                k0 += 2;
                k1 += 2;
                k2 += 2;
                k3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            { 
                ktmp[0] = k0[0];
                ktmp[1] = k1[0];
                ktmp[2] = k2[0];
                ktmp[3] = k3[0];
                ktmp += 4;

                k0 += 1;
                k1 += 1;
                k2 += 1;
                k3 += 1;
            }           
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=remain_outch_start; p<outch; p++)
        {
            const signed char* k0 = kernel + (p+0)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4 + p%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp += 2;
                k0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp++;
                k0++;
            }
        }
    }    

    // 4x4
    // sgemm(int M, int N, int K, float* A, float* B, float* C)
    {
        // int M = outch;  // outch
        // int N = outw * outh; // outsize or out stride
        // int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int i = pp * 4;

            signed char* output0 = top_blob.channel(i);
            signed char* output1 = top_blob.channel(i+1);
            signed char* output2 = top_blob.channel(i+2);
            signed char* output3 = top_blob.channel(i+3);

            const float bias0 = bias ? bias[i] : 0.f;
            const float bias1 = bias ? bias[i+1] : 0.f;
            const float bias2 = bias ? bias[i+2] : 0.f;
            const float bias3 = bias ? bias[i+3] : 0.f;

            const float scale_requant_in0  = scale_requant[2*i];
            const float scale_requant_out0 = scale_requant[2*i+1];
            const float scale_requant_in1  = scale_requant[2*(i+1)];
            const float scale_requant_out1 = scale_requant[2*(i+1)+1];
            const float scale_requant_in2  = scale_requant[2*(i+2)];
            const float scale_requant_out2 = scale_requant[2*(i+2)+1];
            const float scale_requant_in3  = scale_requant[2*(i+3)];
            const float scale_requant_out3 = scale_requant[2*(i+3)+1];

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4);
                
                int sum0[4] = {0};
                int sum1[4] = {0};
                int sum2[4] = {0};
                int sum3[4] = {0};
               
                int k=0;

                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[2*n];   // k0
                        sum0[n] += (int)va[1] * vb[2*n+1];

                        sum1[n] += (int)va[2] * vb[2*n];   // k1
                        sum1[n] += (int)va[3] * vb[2*n+1];

                        sum2[n] += (int)va[4] * vb[2*n];   // k2
                        sum2[n] += (int)va[5] * vb[2*n+1];

                        sum3[n] += (int)va[6] * vb[2*n];   // k3
                        sum3[n] += (int)va[7] * vb[2*n+1];
                    }

                    va += 8;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[n];
                        sum1[n] += (int)va[1] * vb[n];
                        sum2[n] += (int)va[2] * vb[n];
                        sum3[n] += (int)va[3] * vb[n];
                    }
                    
                    va += 4;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output0[n] = float2int8(((float)sum0[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                    output1[n] = float2int8(((float)sum1[n] * scale_requant_in1 + bias1) * scale_requant_out1);
                    output2[n] = float2int8(((float)sum2[n] * scale_requant_in2 + bias2) * scale_requant_out2);
                    output3[n] = float2int8(((float)sum3[n] * scale_requant_in3 + bias3) * scale_requant_out3);
                }
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j<N; j++)
            {                
                int sum0 = 0;
                int sum1 = 0;
                int sum2 = 0;
                int sum3 = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4);

                int k=0;

                for (; k+1<K; k=k+2)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum0 += (int)va[1] * vb[1];

                    sum1 += (int)va[2] * vb[0];
                    sum1 += (int)va[3] * vb[1];

                    sum2 += (int)va[4] * vb[0];
                    sum2 += (int)va[5] * vb[1];

                    sum3 += (int)va[6] * vb[0];
                    sum3 += (int)va[7] * vb[1];

                    va += 8;
                    vb += 2;
                }

                for (; k<K; k++)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum1 += (int)va[1] * vb[0];
                    sum2 += (int)va[2] * vb[0];
                    sum3 += (int)va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }
                
                output0[0] = float2int8(((float)sum0 * scale_requant_in0 + bias0) * scale_requant_out0);
                output1[0] = float2int8(((float)sum1 * scale_requant_in1 + bias1) * scale_requant_out1);
                output2[0] = float2int8(((float)sum2 * scale_requant_in2 + bias2) * scale_requant_out2);
                output3[0] = float2int8(((float)sum3 * scale_requant_in3 + bias3) * scale_requant_out3);

                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_outch_start; i<outch; i++)
        {
            signed char* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;

            const float scale_requant_in0  = scale_requant[2*i];
            const float scale_requant_out0 = scale_requant[2*i+1];            

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4 + i%4);
                int sum[4] = {0};

                int k=0;
                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[2*n];
                        sum[n] += (int)va[1] * vb[2*n+1];
                    }
                    va += 2;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[n];
                    }
                    va += 1;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output[n] = float2int8(((float)sum[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                }
                output += 4;
            }

            for (; j<N; j++)
            {
                int sum = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4 + i%4);

                for (int k=0; k<K; k++)
                {
                    sum += (int)va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = float2int8(((float)sum * scale_requant_in0 + bias0) * scale_requant_out0);

                output++;
            }
        }
    }

    // // sgemm(int M, int N, int K, float* A, float* B, float* C)
    // {
    //     for (int i=0; i<M; i++)
    //     {
    //         int* output = top_blob.channel(i);

    //         for (int j=0; j<N; j++)
    //         {
    //             int sum = 0;

    //             signed char* vb = (signed char*)bottom_im2row + K * j;
    //             const signed char* va = kernel + K * i;

    //             for (int k=0; k<K; k++)
    //             {
    //                 sum += (int)va[0] * vb[0];

    //                 va += 1;
    //                 vb += 1;
    //             }
    //             output[0] = sum;

    //             output++;
    //         }
    //     }
    // }
}